

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.cc
# Opt level: O0

char * string2chars(string *str)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  int local_24;
  int i;
  char *chars;
  int len;
  string *str_local;
  
  iVar1 = std::__cxx11::string::length();
  uVar4 = (ulong)(iVar1 + 1);
  if ((long)uVar4 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pcVar2 = (char *)operator_new__(uVar4);
  local_24 = 0;
  while( true ) {
    uVar4 = std::__cxx11::string::length();
    if (uVar4 <= (ulong)(long)local_24) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
    pcVar2[local_24] = *pcVar3;
    local_24 = local_24 + 1;
  }
  pcVar2[iVar1] = '\0';
  return pcVar2;
}

Assistant:

char *string2chars(const string &str) {
    int len = str.length();
    auto *chars = new char[len + 1];
    for (int i = 0; i < str.length(); i++) {
        chars[i] = str[i];
    }
    chars[len] = 0;
    return chars;
}